

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportBuildFileGenerator.cxx
# Opt level: O0

void __thiscall
cmExportBuildFileGenerator::ComplainAboutMissingTarget
          (cmExportBuildFileGenerator *this,cmGeneratorTarget *depender,cmGeneratorTarget *dependee,
          int occurrences)

{
  bool bVar1;
  ostream *poVar2;
  string *psVar3;
  cmGlobalGenerator *this_00;
  cmake *this_01;
  undefined1 local_1e0 [16];
  string local_1d0;
  undefined1 local_1a0 [8];
  ostringstream e;
  int occurrences_local;
  cmGeneratorTarget *dependee_local;
  cmGeneratorTarget *depender_local;
  cmExportBuildFileGenerator *this_local;
  
  bVar1 = cmSystemTools::GetErrorOccuredFlag();
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
    poVar2 = std::operator<<((ostream *)local_1a0,"export called with target \"");
    psVar3 = cmGeneratorTarget::GetName_abi_cxx11_(depender);
    poVar2 = std::operator<<(poVar2,(string *)psVar3);
    poVar2 = std::operator<<(poVar2,"\" which requires target \"");
    psVar3 = cmGeneratorTarget::GetName_abi_cxx11_(dependee);
    poVar2 = std::operator<<(poVar2,(string *)psVar3);
    std::operator<<(poVar2,"\" ");
    if (occurrences == 0) {
      std::operator<<((ostream *)local_1a0,"that is not in the export set.\n");
    }
    else {
      poVar2 = std::operator<<((ostream *)local_1a0,"that is not in this export set, but ");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,occurrences);
      std::operator<<(poVar2," times in others.\n");
    }
    poVar2 = std::operator<<((ostream *)local_1a0,
                             "If the required target is not easy to reference in this call, ");
    std::operator<<(poVar2,"consider using the APPEND option with multiple separate calls.");
    this_00 = cmLocalGenerator::GetGlobalGenerator(this->LG);
    this_01 = cmGlobalGenerator::GetCMakeInstance(this_00);
    std::__cxx11::ostringstream::str();
    cmLocalGenerator::GetMakefile(this->LG);
    cmMakefile::GetBacktrace((cmMakefile *)local_1e0);
    cmake::IssueMessage(this_01,FATAL_ERROR,(string *)(local_1e0 + 0x10),
                        (cmListFileBacktrace *)local_1e0);
    cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)local_1e0);
    std::__cxx11::string::~string((string *)(local_1e0 + 0x10));
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a0);
  }
  return;
}

Assistant:

void cmExportBuildFileGenerator::ComplainAboutMissingTarget(
  cmGeneratorTarget* depender, cmGeneratorTarget* dependee, int occurrences)
{
  if (cmSystemTools::GetErrorOccuredFlag()) {
    return;
  }

  std::ostringstream e;
  e << "export called with target \"" << depender->GetName()
    << "\" which requires target \"" << dependee->GetName() << "\" ";
  if (occurrences == 0) {
    e << "that is not in the export set.\n";
  } else {
    e << "that is not in this export set, but " << occurrences
      << " times in others.\n";
  }
  e << "If the required target is not easy to reference in this call, "
    << "consider using the APPEND option with multiple separate calls.";

  this->LG->GetGlobalGenerator()->GetCMakeInstance()->IssueMessage(
    MessageType::FATAL_ERROR, e.str(),
    this->LG->GetMakefile()->GetBacktrace());
}